

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_templates.h
# Opt level: O1

void __thiscall UniqueList<GLSkyInfo>::Clear(UniqueList<GLSkyInfo> *this)

{
  uint uVar1;
  GLSkyInfo *pGVar2;
  ulong uVar3;
  
  if ((this->Array).Count != 0) {
    uVar3 = 0;
    do {
      pGVar2 = (this->Array).Array[uVar3];
      if (pGVar2 != (GLSkyInfo *)0x0) {
        operator_delete(pGVar2,0x30);
      }
      uVar3 = uVar3 + 1;
      uVar1 = (this->Array).Count;
    } while (uVar3 < uVar1);
    if (uVar1 != 0) {
      (this->Array).Count = 0;
    }
  }
  return;
}

Assistant:

void Clear()
	{
		for(unsigned i=0;i<Array.Size();i++) TheFreeList.Release(Array[i]);
		Array.Clear();
	}